

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Scene *pSVar8;
  Ref<embree::Geometry> *pRVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  byte bVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  uint uVar28;
  undefined1 (*pauVar29) [16];
  long lVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  undefined1 (*pauVar36) [16];
  ulong uVar37;
  long lVar38;
  undefined1 (*pauVar39) [16];
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  ulong uVar46;
  AABBNodeMB4D *node1;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  undefined1 (*pauVar50) [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar52 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar86 [16];
  float fVar85;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar89 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  uint uVar96;
  uint uVar97;
  undefined1 auVar95 [64];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined4 uVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2950 [16];
  undefined1 (*local_2938) [16];
  ulong local_2930;
  long local_2928;
  ulong local_2920;
  ulong local_2918;
  long local_2910;
  ulong local_2908;
  ulong local_2900;
  ulong local_28f8;
  ulong local_28f0;
  ulong local_28e8;
  ulong local_28e0;
  ulong local_28d8;
  RTCFilterFunctionNArguments local_28d0;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2830 [16];
  undefined1 local_2820 [16];
  undefined1 local_2810 [16];
  undefined1 local_2800 [16];
  undefined1 local_27f0 [16];
  undefined1 local_27e0 [16];
  undefined1 local_27d0 [16];
  undefined1 local_27c0 [16];
  undefined1 local_27b0 [16];
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  RTCHitN local_2770 [16];
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  undefined1 local_2740 [16];
  undefined4 local_2730;
  undefined4 uStack_272c;
  undefined4 uStack_2728;
  undefined4 uStack_2724;
  undefined4 local_2720;
  undefined4 uStack_271c;
  undefined4 uStack_2718;
  undefined4 uStack_2714;
  uint local_2710;
  uint uStack_270c;
  uint uStack_2708;
  uint uStack_2704;
  uint local_2700;
  uint uStack_26fc;
  uint uStack_26f8;
  uint uStack_26f4;
  uint uStack_26f0;
  uint uStack_26ec;
  uint uStack_26e8;
  uint uStack_26e4;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar29 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_2400._4_4_ = fVar1;
  local_2400._0_4_ = fVar1;
  local_2400._8_4_ = fVar1;
  local_2400._12_4_ = fVar1;
  local_2400._16_4_ = fVar1;
  local_2400._20_4_ = fVar1;
  local_2400._24_4_ = fVar1;
  local_2400._28_4_ = fVar1;
  auVar78 = ZEXT3264(local_2400);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2420._4_4_ = fVar2;
  local_2420._0_4_ = fVar2;
  local_2420._8_4_ = fVar2;
  local_2420._12_4_ = fVar2;
  local_2420._16_4_ = fVar2;
  local_2420._20_4_ = fVar2;
  local_2420._24_4_ = fVar2;
  local_2420._28_4_ = fVar2;
  auVar84 = ZEXT3264(local_2420);
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2440._4_4_ = fVar85;
  local_2440._0_4_ = fVar85;
  local_2440._8_4_ = fVar85;
  local_2440._12_4_ = fVar85;
  local_2440._16_4_ = fVar85;
  local_2440._20_4_ = fVar85;
  local_2440._24_4_ = fVar85;
  local_2440._28_4_ = fVar85;
  auVar89 = ZEXT3264(local_2440);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar85 = fVar85 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2930 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_28d8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar49 = local_2930 ^ 0x20;
  uVar48 = local_28d8 ^ 0x20;
  iVar32 = (tray->tfar).field_0.i[k];
  auVar58 = ZEXT3264(CONCAT428(iVar32,CONCAT424(iVar32,CONCAT420(iVar32,CONCAT416(iVar32,CONCAT412(
                                                  iVar32,CONCAT48(iVar32,CONCAT44(iVar32,iVar32)))))
                                               )));
  local_23e0._8_4_ = 0x80000000;
  local_23e0._0_8_ = 0x8000000080000000;
  local_23e0._12_4_ = 0x80000000;
  local_23e0._16_4_ = 0x80000000;
  local_23e0._20_4_ = 0x80000000;
  local_23e0._24_4_ = 0x80000000;
  local_23e0._28_4_ = 0x80000000;
  local_2460._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_2460._8_4_ = -fVar1;
  local_2460._12_4_ = -fVar1;
  local_2460._16_4_ = -fVar1;
  local_2460._20_4_ = -fVar1;
  local_2460._24_4_ = -fVar1;
  local_2460._28_4_ = -fVar1;
  auVar95 = ZEXT3264(local_2460);
  local_2480._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_2480._8_4_ = -fVar2;
  local_2480._12_4_ = -fVar2;
  local_2480._16_4_ = -fVar2;
  local_2480._20_4_ = -fVar2;
  local_2480._24_4_ = -fVar2;
  local_2480._28_4_ = -fVar2;
  auVar100 = ZEXT3264(local_2480);
  iVar32 = (tray->tnear).field_0.i[k];
  local_24a0._4_4_ = iVar32;
  local_24a0._0_4_ = iVar32;
  local_24a0._8_4_ = iVar32;
  local_24a0._12_4_ = iVar32;
  local_24a0._16_4_ = iVar32;
  local_24a0._20_4_ = iVar32;
  local_24a0._24_4_ = iVar32;
  local_24a0._28_4_ = iVar32;
  auVar105 = ZEXT3264(local_24a0);
  local_24e0._16_16_ = mm_lookupmask_ps._240_16_;
  local_24e0._0_16_ = mm_lookupmask_ps._0_16_;
  local_24c0._0_8_ = CONCAT44(fVar85,fVar85) ^ 0x8000000080000000;
  local_24c0._8_4_ = -fVar85;
  local_24c0._12_4_ = -fVar85;
  local_24c0._16_4_ = -fVar85;
  local_24c0._20_4_ = -fVar85;
  local_24c0._24_4_ = -fVar85;
  local_24c0._28_4_ = -fVar85;
  auVar108 = ZEXT3264(local_24c0);
  local_2938 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar55._8_4_ = 0x3f800000;
  auVar55._0_8_ = 0x3f8000003f800000;
  auVar55._12_4_ = 0x3f800000;
  auVar55._16_4_ = 0x3f800000;
  auVar55._20_4_ = 0x3f800000;
  auVar55._24_4_ = 0x3f800000;
  auVar55._28_4_ = 0x3f800000;
  auVar83._8_4_ = 0xbf800000;
  auVar83._0_8_ = 0xbf800000bf800000;
  auVar83._12_4_ = 0xbf800000;
  auVar83._16_4_ = 0xbf800000;
  auVar83._20_4_ = 0xbf800000;
  auVar83._24_4_ = 0xbf800000;
  auVar83._28_4_ = 0xbf800000;
  local_2500 = vblendvps_avx(auVar55,auVar83,local_24e0);
  uVar40 = local_2930;
LAB_005ea0a5:
  do {
    pauVar50 = pauVar29 + -1;
    pauVar29 = pauVar29 + -1;
    if (*(float *)(*pauVar50 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar37 = *(ulong *)*pauVar29;
      while ((uVar37 & 8) == 0) {
        uVar47 = uVar37 & 0xfffffffffffffff0;
        uVar109 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar62._4_4_ = uVar109;
        auVar62._0_4_ = uVar109;
        auVar62._8_4_ = uVar109;
        auVar62._12_4_ = uVar109;
        auVar62._16_4_ = uVar109;
        auVar62._20_4_ = uVar109;
        auVar62._24_4_ = uVar109;
        auVar62._28_4_ = uVar109;
        auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + uVar40),auVar62,
                                  *(undefined1 (*) [32])(uVar47 + 0x40 + uVar40));
        auVar63 = auVar78._0_32_;
        auVar94 = auVar95._0_32_;
        auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),auVar63,auVar94);
        auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + uVar44),auVar62,
                                  *(undefined1 (*) [32])(uVar47 + 0x40 + uVar44));
        auVar80 = auVar84._0_32_;
        auVar98 = auVar100._0_32_;
        auVar64 = vfmadd213ps_fma(ZEXT1632(auVar64),auVar80,auVar98);
        auVar83 = vpmaxsd_avx2(ZEXT1632(auVar59),ZEXT1632(auVar64));
        auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + local_28d8),auVar62,
                                  *(undefined1 (*) [32])(uVar47 + 0x40 + local_28d8));
        auVar87 = auVar89._0_32_;
        auVar53 = auVar108._0_32_;
        auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),auVar87,auVar53);
        auVar55 = vpmaxsd_avx2(ZEXT1632(auVar59),auVar105._0_32_);
        auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + uVar49),auVar62,
                                  *(undefined1 (*) [32])(uVar47 + 0x40 + uVar49));
        local_26e0 = vpmaxsd_avx2(auVar83,auVar55);
        auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + (uVar44 ^ 0x20)),auVar62,
                                  *(undefined1 (*) [32])(uVar47 + 0x40 + (uVar44 ^ 0x20)));
        auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),auVar63,auVar94);
        auVar64 = vfmadd213ps_fma(ZEXT1632(auVar64),auVar80,auVar98);
        auVar83 = vpminsd_avx2(ZEXT1632(auVar59),ZEXT1632(auVar64));
        auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + uVar48),auVar62,
                                  *(undefined1 (*) [32])(uVar47 + 0x40 + uVar48));
        auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),auVar87,auVar53);
        auVar55 = vpminsd_avx2(ZEXT1632(auVar59),auVar58._0_32_);
        auVar83 = vpminsd_avx2(auVar83,auVar55);
        auVar83 = vcmpps_avx(local_26e0,auVar83,2);
        if (((uint)uVar37 & 7) == 6) {
          auVar55 = vcmpps_avx(*(undefined1 (*) [32])(uVar47 + 0x1c0),auVar62,2);
          auVar62 = vcmpps_avx(auVar62,*(undefined1 (*) [32])(uVar47 + 0x1e0),1);
          auVar55 = vandps_avx(auVar55,auVar62);
          auVar83 = vandps_avx(auVar55,auVar83);
          auVar59 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
        }
        else {
          auVar59 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
        }
        auVar59 = vpsllw_avx(auVar59,0xf);
        if ((((((((auVar59 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar59 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar59 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar59 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar59 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar59[0xf]
           ) {
          if (pauVar29 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_005ea0a5;
        }
        auVar59 = vpacksswb_avx(auVar59,auVar59);
        bVar19 = SUB161(auVar59 >> 7,0) & 1 | (SUB161(auVar59 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar59 >> 0x17,0) & 1) << 2 | (SUB161(auVar59 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar59 >> 0x27,0) & 1) << 4 | (SUB161(auVar59 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar59 >> 0x37,0) & 1) << 6 | SUB161(auVar59 >> 0x3f,0) << 7;
        lVar31 = 0;
        for (uVar37 = (ulong)bVar19; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
          lVar31 = lVar31 + 1;
        }
        uVar37 = *(ulong *)(uVar47 + lVar31 * 8);
        uVar34 = bVar19 - 1 & (uint)bVar19;
        uVar35 = (ulong)uVar34;
        if (uVar34 != 0) {
          uVar28 = *(uint *)(local_26e0 + lVar31 * 4);
          lVar31 = 0;
          for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
            lVar31 = lVar31 + 1;
          }
          uVar34 = uVar34 - 1 & uVar34;
          uVar41 = (ulong)uVar34;
          uVar35 = *(ulong *)(uVar47 + lVar31 * 8);
          uVar96 = *(uint *)(local_26e0 + lVar31 * 4);
          if (uVar34 == 0) {
            if (uVar28 < uVar96) {
              *(ulong *)*pauVar29 = uVar35;
              *(uint *)(*pauVar29 + 8) = uVar96;
              pauVar29 = pauVar29 + 1;
            }
            else {
              *(ulong *)*pauVar29 = uVar37;
              *(uint *)(*pauVar29 + 8) = uVar28;
              pauVar29 = pauVar29 + 1;
              uVar37 = uVar35;
            }
          }
          else {
            auVar59._8_8_ = 0;
            auVar59._0_8_ = uVar37;
            auVar59 = vpunpcklqdq_avx(auVar59,ZEXT416(uVar28));
            auVar64._8_8_ = 0;
            auVar64._0_8_ = uVar35;
            auVar64 = vpunpcklqdq_avx(auVar64,ZEXT416(uVar96));
            lVar31 = 0;
            for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
              lVar31 = lVar31 + 1;
            }
            uVar34 = uVar34 - 1 & uVar34;
            uVar37 = (ulong)uVar34;
            auVar68._8_8_ = 0;
            auVar68._0_8_ = *(ulong *)(uVar47 + lVar31 * 8);
            auVar60 = vpunpcklqdq_avx(auVar68,ZEXT416(*(uint *)(local_26e0 + lVar31 * 4)));
            auVar68 = vpcmpgtd_avx(auVar64,auVar59);
            if (uVar34 == 0) {
              auVar72 = vpshufd_avx(auVar68,0xaa);
              auVar68 = vblendvps_avx(auVar64,auVar59,auVar72);
              auVar59 = vblendvps_avx(auVar59,auVar64,auVar72);
              auVar64 = vpcmpgtd_avx(auVar60,auVar68);
              auVar72 = vpshufd_avx(auVar64,0xaa);
              auVar64 = vblendvps_avx(auVar60,auVar68,auVar72);
              auVar68 = vblendvps_avx(auVar68,auVar60,auVar72);
              auVar60 = vpcmpgtd_avx(auVar68,auVar59);
              auVar72 = vpshufd_avx(auVar60,0xaa);
              auVar60 = vblendvps_avx(auVar68,auVar59,auVar72);
              auVar59 = vblendvps_avx(auVar59,auVar68,auVar72);
              *pauVar29 = auVar59;
              pauVar29[1] = auVar60;
              uVar37 = auVar64._0_8_;
              pauVar29 = pauVar29 + 2;
            }
            else {
              lVar31 = 0;
              for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                lVar31 = lVar31 + 1;
              }
              uVar34 = uVar34 - 1 & uVar34;
              uVar35 = (ulong)uVar34;
              auVar72._8_8_ = 0;
              auVar72._0_8_ = *(ulong *)(uVar47 + lVar31 * 8);
              auVar72 = vpunpcklqdq_avx(auVar72,ZEXT416(*(uint *)(local_26e0 + lVar31 * 4)));
              if (uVar34 == 0) {
                auVar51 = vpshufd_avx(auVar68,0xaa);
                auVar68 = vblendvps_avx(auVar64,auVar59,auVar51);
                auVar59 = vblendvps_avx(auVar59,auVar64,auVar51);
                auVar64 = vpcmpgtd_avx(auVar72,auVar60);
                auVar51 = vpshufd_avx(auVar64,0xaa);
                auVar64 = vblendvps_avx(auVar72,auVar60,auVar51);
                auVar60 = vblendvps_avx(auVar60,auVar72,auVar51);
                auVar72 = vpcmpgtd_avx(auVar60,auVar59);
                auVar51 = vpshufd_avx(auVar72,0xaa);
                auVar72 = vblendvps_avx(auVar60,auVar59,auVar51);
                auVar59 = vblendvps_avx(auVar59,auVar60,auVar51);
                auVar60 = vpcmpgtd_avx(auVar64,auVar68);
                auVar51 = vpshufd_avx(auVar60,0xaa);
                auVar60 = vblendvps_avx(auVar64,auVar68,auVar51);
                auVar64 = vblendvps_avx(auVar68,auVar64,auVar51);
                auVar68 = vpcmpgtd_avx(auVar72,auVar64);
                auVar51 = vpshufd_avx(auVar68,0xaa);
                auVar68 = vblendvps_avx(auVar72,auVar64,auVar51);
                auVar64 = vblendvps_avx(auVar64,auVar72,auVar51);
                *pauVar29 = auVar59;
                pauVar29[1] = auVar64;
                pauVar29[2] = auVar68;
                uVar37 = auVar60._0_8_;
                pauVar50 = pauVar29 + 3;
              }
              else {
                *pauVar29 = auVar59;
                pauVar29[1] = auVar64;
                pauVar29[2] = auVar60;
                pauVar29[3] = auVar72;
                lVar31 = 0x30;
                do {
                  lVar38 = lVar31;
                  lVar31 = 0;
                  for (uVar37 = uVar35; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000
                      ) {
                    lVar31 = lVar31 + 1;
                  }
                  uVar37 = *(ulong *)(uVar47 + lVar31 * 8);
                  auVar60._8_8_ = 0;
                  auVar60._0_8_ = uVar37;
                  auVar59 = vpunpcklqdq_avx(auVar60,ZEXT416(*(uint *)(local_26e0 + lVar31 * 4)));
                  *(undefined1 (*) [16])(pauVar29[1] + lVar38) = auVar59;
                  uVar35 = uVar35 - 1 & uVar35;
                  lVar31 = lVar38 + 0x10;
                } while (uVar35 != 0);
                pauVar50 = (undefined1 (*) [16])(pauVar29[1] + lVar38);
                if (lVar38 + 0x10 != 0) {
                  lVar31 = 0x10;
                  pauVar36 = pauVar29;
                  do {
                    auVar59 = pauVar36[1];
                    pauVar36 = pauVar36 + 1;
                    uVar34 = vextractps_avx(auVar59,2);
                    lVar38 = lVar31;
                    do {
                      if (uVar34 <= *(uint *)(pauVar29[-1] + lVar38 + 8)) {
                        pauVar39 = (undefined1 (*) [16])(*pauVar29 + lVar38);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar29 + lVar38) =
                           *(undefined1 (*) [16])(pauVar29[-1] + lVar38);
                      lVar38 = lVar38 + -0x10;
                      pauVar39 = pauVar29;
                    } while (lVar38 != 0);
                    *pauVar39 = auVar59;
                    lVar31 = lVar31 + 0x10;
                  } while (pauVar50 != pauVar36);
                  uVar37 = *(ulong *)*pauVar50;
                }
              }
              auVar78 = ZEXT3264(auVar63);
              auVar84 = ZEXT3264(auVar80);
              auVar89 = ZEXT3264(auVar87);
              auVar95 = ZEXT3264(auVar94);
              auVar100 = ZEXT3264(auVar98);
              auVar105 = ZEXT3264(auVar105._0_32_);
              auVar108 = ZEXT3264(auVar53);
              pauVar29 = pauVar50;
            }
          }
        }
      }
      local_2928 = (ulong)((uint)uVar37 & 0xf) - 8;
      if (local_2928 != 0) {
        uVar37 = uVar37 & 0xfffffffffffffff0;
        lVar31 = 0;
        do {
          lVar30 = lVar31 * 0x60;
          pSVar8 = context->scene;
          pRVar9 = (pSVar8->geometries).items;
          pGVar10 = pRVar9[*(uint *)(uVar37 + 0x40 + lVar30)].ptr;
          fVar1 = (pGVar10->time_range).lower;
          fVar1 = pGVar10->fnumTimeSegments *
                  ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar10->time_range).upper - fVar1))
          ;
          auVar59 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
          auVar59 = vminss_avx(auVar59,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
          auVar61 = vmaxss_avx(ZEXT816(0) << 0x20,auVar59);
          iVar32 = (int)auVar61._0_4_;
          lVar45 = (long)iVar32 * 0x38;
          lVar38 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar45);
          local_28f8 = (ulong)*(uint *)(uVar37 + 4 + lVar30);
          auVar59 = *(undefined1 (*) [16])(lVar38 + (ulong)*(uint *)(uVar37 + lVar30) * 4);
          uVar47 = (ulong)*(uint *)(uVar37 + 0x10 + lVar30);
          auVar64 = *(undefined1 (*) [16])(lVar38 + uVar47 * 4);
          uVar35 = (ulong)*(uint *)(uVar37 + 0x20 + lVar30);
          auVar68 = *(undefined1 (*) [16])(lVar38 + uVar35 * 4);
          uVar41 = (ulong)*(uint *)(uVar37 + 0x30 + lVar30);
          auVar60 = *(undefined1 (*) [16])(lVar38 + uVar41 * 4);
          local_2910 = *(long *)&pRVar9[*(uint *)(uVar37 + 0x44 + lVar30)].ptr[2].numPrimitives;
          lVar38 = *(long *)(local_2910 + lVar45);
          auVar72 = *(undefined1 (*) [16])(lVar38 + local_28f8 * 4);
          local_28e8 = (ulong)*(uint *)(uVar37 + 0x14 + lVar30);
          auVar51 = *(undefined1 (*) [16])(lVar38 + local_28e8 * 4);
          local_28e0 = (ulong)*(uint *)(uVar37 + 0x24 + lVar30);
          auVar52 = *(undefined1 (*) [16])(lVar38 + local_28e0 * 4);
          uVar42 = (ulong)*(uint *)(uVar37 + 0x34 + lVar30);
          auVar4 = *(undefined1 (*) [16])(lVar38 + uVar42 * 4);
          lVar38 = *(long *)&pRVar9[*(uint *)(uVar37 + 0x48 + lVar30)].ptr[2].numPrimitives;
          lVar11 = *(long *)(lVar38 + lVar45);
          uVar43 = (ulong)*(uint *)(uVar37 + 8 + lVar30);
          auVar5 = *(undefined1 (*) [16])(lVar11 + uVar43 * 4);
          local_2908 = (ulong)*(uint *)(uVar37 + 0x18 + lVar30);
          auVar6 = *(undefined1 (*) [16])(lVar11 + local_2908 * 4);
          local_2900 = (ulong)*(uint *)(uVar37 + 0x28 + lVar30);
          auVar65 = *(undefined1 (*) [16])(lVar11 + local_2900 * 4);
          local_28f0 = (ulong)*(uint *)(uVar37 + 0x38 + lVar30);
          auVar7 = *(undefined1 (*) [16])(lVar11 + local_28f0 * 4);
          fVar1 = fVar1 - auVar61._0_4_;
          lVar11 = *(long *)&pRVar9[*(uint *)(uVar37 + 0x4c + lVar30)].ptr[2].numPrimitives;
          lVar45 = *(long *)(lVar11 + lVar45);
          uVar40 = (ulong)*(uint *)(uVar37 + 0xc + lVar30);
          auVar61 = *(undefined1 (*) [16])(lVar45 + uVar40 * 4);
          local_2920 = (ulong)*(uint *)(uVar37 + 0x1c + lVar30);
          auVar69 = *(undefined1 (*) [16])(lVar45 + local_2920 * 4);
          auVar73 = vunpcklps_avx(auVar59,auVar5);
          auVar5 = vunpckhps_avx(auVar59,auVar5);
          auVar86 = vunpcklps_avx(auVar72,auVar61);
          auVar72 = vunpckhps_avx(auVar72,auVar61);
          uVar46 = (ulong)*(uint *)(uVar37 + 0x2c + lVar30);
          auVar59 = *(undefined1 (*) [16])(lVar45 + uVar46 * 4);
          local_27c0 = vunpcklps_avx(auVar5,auVar72);
          auVar5 = vunpcklps_avx(auVar73,auVar86);
          local_27e0 = vunpckhps_avx(auVar73,auVar86);
          auVar61 = vunpcklps_avx(auVar64,auVar6);
          auVar72 = vunpckhps_avx(auVar64,auVar6);
          auVar6 = vunpcklps_avx(auVar51,auVar69);
          auVar51 = vunpckhps_avx(auVar51,auVar69);
          local_2918 = (ulong)*(uint *)(uVar37 + 0x3c + lVar30);
          auVar64 = *(undefined1 (*) [16])(lVar45 + local_2918 * 4);
          local_27b0 = vunpcklps_avx(auVar72,auVar51);
          local_27f0 = vunpcklps_avx(auVar61,auVar6);
          local_27d0 = vunpckhps_avx(auVar61,auVar6);
          auVar51 = vunpcklps_avx(auVar68,auVar65);
          auVar68 = vunpckhps_avx(auVar68,auVar65);
          auVar6 = vunpcklps_avx(auVar52,auVar59);
          auVar72 = vunpckhps_avx(auVar52,auVar59);
          lVar33 = (long)(iVar32 + 1) * 0x38;
          lVar45 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar33);
          auVar59 = *(undefined1 (*) [16])(lVar45 + (ulong)*(uint *)(uVar37 + lVar30) * 4);
          auVar52 = vunpcklps_avx(auVar68,auVar72);
          local_2820 = vunpcklps_avx(auVar51,auVar6);
          local_2800 = vunpckhps_avx(auVar51,auVar6);
          auVar72 = vunpcklps_avx(auVar60,auVar7);
          auVar68 = vunpckhps_avx(auVar60,auVar7);
          auVar51 = vunpcklps_avx(auVar4,auVar64);
          auVar60 = vunpckhps_avx(auVar4,auVar64);
          lVar38 = *(long *)(lVar38 + lVar33);
          auVar64 = *(undefined1 (*) [16])(lVar38 + uVar43 * 4);
          auVar4 = vunpcklps_avx(auVar68,auVar60);
          local_2830 = vunpcklps_avx(auVar72,auVar51);
          local_2810 = vunpckhps_avx(auVar72,auVar51);
          lVar12 = *(long *)(local_2910 + lVar33);
          auVar60 = vunpcklps_avx(auVar59,auVar64);
          auVar68 = vunpckhps_avx(auVar59,auVar64);
          auVar59 = *(undefined1 (*) [16])(lVar12 + local_28f8 * 4);
          lVar11 = *(long *)(lVar11 + lVar33);
          auVar64 = *(undefined1 (*) [16])(lVar11 + uVar40 * 4);
          auVar72 = vunpcklps_avx(auVar59,auVar64);
          auVar59 = vunpckhps_avx(auVar59,auVar64);
          auVar6 = vunpcklps_avx(auVar68,auVar59);
          auVar65 = vunpcklps_avx(auVar60,auVar72);
          auVar68 = vunpckhps_avx(auVar60,auVar72);
          auVar59 = *(undefined1 (*) [16])(lVar45 + uVar47 * 4);
          auVar64 = *(undefined1 (*) [16])(lVar38 + local_2908 * 4);
          auVar72 = vunpcklps_avx(auVar59,auVar64);
          auVar60 = vunpckhps_avx(auVar59,auVar64);
          auVar59 = *(undefined1 (*) [16])(lVar12 + local_28e8 * 4);
          auVar64 = *(undefined1 (*) [16])(lVar11 + local_2920 * 4);
          auVar51 = vunpcklps_avx(auVar59,auVar64);
          auVar59 = vunpckhps_avx(auVar59,auVar64);
          auVar7 = vunpcklps_avx(auVar60,auVar59);
          auVar61 = vunpcklps_avx(auVar72,auVar51);
          auVar60 = vunpckhps_avx(auVar72,auVar51);
          auVar59 = *(undefined1 (*) [16])(lVar45 + uVar35 * 4);
          auVar64 = *(undefined1 (*) [16])(lVar38 + local_2900 * 4);
          auVar51 = vunpcklps_avx(auVar59,auVar64);
          auVar72 = vunpckhps_avx(auVar59,auVar64);
          auVar59 = *(undefined1 (*) [16])(lVar12 + local_28e0 * 4);
          auVar64 = *(undefined1 (*) [16])(lVar11 + uVar46 * 4);
          auVar69 = vunpcklps_avx(auVar59,auVar64);
          auVar59 = vunpckhps_avx(auVar59,auVar64);
          auVar73 = vunpcklps_avx(auVar72,auVar59);
          auVar86 = vunpcklps_avx(auVar51,auVar69);
          auVar72 = vunpckhps_avx(auVar51,auVar69);
          auVar59 = *(undefined1 (*) [16])(lVar45 + uVar41 * 4);
          auVar64 = *(undefined1 (*) [16])(lVar38 + local_28f0 * 4);
          auVar69 = vunpcklps_avx(auVar59,auVar64);
          auVar51 = vunpckhps_avx(auVar59,auVar64);
          auVar59 = *(undefined1 (*) [16])(lVar12 + uVar42 * 4);
          auVar64 = *(undefined1 (*) [16])(lVar11 + local_2918 * 4);
          auVar71 = vunpcklps_avx(auVar59,auVar64);
          auVar59 = vunpckhps_avx(auVar59,auVar64);
          auVar64 = vunpcklps_avx(auVar51,auVar59);
          auVar51 = vunpcklps_avx(auVar69,auVar71);
          auVar59 = vunpckhps_avx(auVar69,auVar71);
          fVar2 = 1.0 - fVar1;
          auVar110._4_4_ = fVar2;
          auVar110._0_4_ = fVar2;
          auVar110._8_4_ = fVar2;
          auVar110._12_4_ = fVar2;
          auVar69._0_4_ = fVar1 * auVar65._0_4_;
          auVar69._4_4_ = fVar1 * auVar65._4_4_;
          auVar69._8_4_ = fVar1 * auVar65._8_4_;
          auVar69._12_4_ = fVar1 * auVar65._12_4_;
          auVar5 = vfmadd231ps_fma(auVar69,auVar110,auVar5);
          auVar75._0_4_ = fVar1 * auVar68._0_4_;
          auVar75._4_4_ = fVar1 * auVar68._4_4_;
          auVar75._8_4_ = fVar1 * auVar68._8_4_;
          auVar75._12_4_ = fVar1 * auVar68._12_4_;
          auVar68 = vfmadd231ps_fma(auVar75,auVar110,local_27e0);
          auVar71._0_4_ = auVar6._0_4_ * fVar1;
          auVar71._4_4_ = auVar6._4_4_ * fVar1;
          auVar71._8_4_ = auVar6._8_4_ * fVar1;
          auVar71._12_4_ = auVar6._12_4_ * fVar1;
          auVar6 = vfmadd231ps_fma(auVar71,auVar110,local_27c0);
          auVar65._0_4_ = fVar1 * auVar61._0_4_;
          auVar65._4_4_ = fVar1 * auVar61._4_4_;
          auVar65._8_4_ = fVar1 * auVar61._8_4_;
          auVar65._12_4_ = fVar1 * auVar61._12_4_;
          auVar65 = vfmadd231ps_fma(auVar65,auVar110,local_27f0);
          auVar61._0_4_ = fVar1 * auVar60._0_4_;
          auVar61._4_4_ = fVar1 * auVar60._4_4_;
          auVar61._8_4_ = fVar1 * auVar60._8_4_;
          auVar61._12_4_ = fVar1 * auVar60._12_4_;
          auVar60 = vfmadd231ps_fma(auVar61,auVar110,local_27d0);
          auVar79._0_4_ = auVar7._0_4_ * fVar1;
          auVar79._4_4_ = auVar7._4_4_ * fVar1;
          auVar79._8_4_ = auVar7._8_4_ * fVar1;
          auVar79._12_4_ = auVar7._12_4_ * fVar1;
          auVar7 = vfmadd231ps_fma(auVar79,auVar110,local_27b0);
          auVar93._0_4_ = auVar86._0_4_ * fVar1;
          auVar93._4_4_ = auVar86._4_4_ * fVar1;
          auVar93._8_4_ = auVar86._8_4_ * fVar1;
          auVar93._12_4_ = auVar86._12_4_ * fVar1;
          auVar61 = vfmadd231ps_fma(auVar93,auVar110,local_2820);
          auVar101._0_4_ = auVar72._0_4_ * fVar1;
          auVar101._4_4_ = auVar72._4_4_ * fVar1;
          auVar101._8_4_ = auVar72._8_4_ * fVar1;
          auVar101._12_4_ = auVar72._12_4_ * fVar1;
          auVar72 = vfmadd231ps_fma(auVar101,auVar110,local_2800);
          auVar106._0_4_ = auVar73._0_4_ * fVar1;
          auVar106._4_4_ = auVar73._4_4_ * fVar1;
          auVar106._8_4_ = auVar73._8_4_ * fVar1;
          auVar106._12_4_ = auVar73._12_4_ * fVar1;
          auVar52 = vfmadd231ps_fma(auVar106,auVar110,auVar52);
          auVar73._0_4_ = fVar1 * auVar51._0_4_;
          auVar73._4_4_ = fVar1 * auVar51._4_4_;
          auVar73._8_4_ = fVar1 * auVar51._8_4_;
          auVar73._12_4_ = fVar1 * auVar51._12_4_;
          auVar86._0_4_ = auVar59._0_4_ * fVar1;
          auVar86._4_4_ = auVar59._4_4_ * fVar1;
          auVar86._8_4_ = auVar59._8_4_ * fVar1;
          auVar86._12_4_ = auVar59._12_4_ * fVar1;
          auVar51._0_4_ = auVar64._0_4_ * fVar1;
          auVar51._4_4_ = auVar64._4_4_ * fVar1;
          auVar51._8_4_ = auVar64._8_4_ * fVar1;
          auVar51._12_4_ = auVar64._12_4_ * fVar1;
          lVar38 = uVar37 + 0x40 + lVar30;
          local_23c0 = *(undefined8 *)(lVar38 + 0x10);
          uStack_23b8 = *(undefined8 *)(lVar38 + 0x18);
          auVar59 = vfmadd231ps_fma(auVar73,auVar110,local_2830);
          uStack_23b0 = local_23c0;
          uStack_23a8 = uStack_23b8;
          lVar30 = uVar37 + 0x50 + lVar30;
          local_27a0 = *(undefined8 *)(lVar30 + 0x10);
          uStack_2798 = *(undefined8 *)(lVar30 + 0x18);
          auVar64 = vfmadd231ps_fma(auVar86,auVar110,local_2810);
          auVar51 = vfmadd231ps_fma(auVar51,auVar110,auVar4);
          uStack_2790 = local_27a0;
          uStack_2788 = uStack_2798;
          auVar111._16_16_ = auVar61;
          auVar111._0_16_ = auVar5;
          auVar76._16_16_ = auVar72;
          auVar76._0_16_ = auVar68;
          auVar102._16_16_ = auVar52;
          auVar102._0_16_ = auVar6;
          auVar66._16_16_ = auVar65;
          auVar66._0_16_ = auVar65;
          auVar63._16_16_ = auVar60;
          auVar63._0_16_ = auVar60;
          auVar70._16_16_ = auVar7;
          auVar70._0_16_ = auVar7;
          auVar74._16_16_ = auVar59;
          auVar74._0_16_ = auVar59;
          auVar81._16_16_ = auVar64;
          auVar81._0_16_ = auVar64;
          auVar53._16_16_ = auVar51;
          auVar53._0_16_ = auVar51;
          auVar55 = vsubps_avx(auVar111,auVar66);
          auVar83 = vsubps_avx(auVar76,auVar63);
          auVar62 = vsubps_avx(auVar102,auVar70);
          auVar63 = vsubps_avx(auVar74,auVar111);
          auVar80 = vsubps_avx(auVar81,auVar76);
          auVar87 = vsubps_avx(auVar53,auVar102);
          auVar94._4_4_ = auVar83._4_4_ * auVar87._4_4_;
          auVar94._0_4_ = auVar83._0_4_ * auVar87._0_4_;
          auVar94._8_4_ = auVar83._8_4_ * auVar87._8_4_;
          auVar94._12_4_ = auVar83._12_4_ * auVar87._12_4_;
          auVar94._16_4_ = auVar83._16_4_ * auVar87._16_4_;
          auVar94._20_4_ = auVar83._20_4_ * auVar87._20_4_;
          auVar94._24_4_ = auVar83._24_4_ * auVar87._24_4_;
          auVar94._28_4_ = auVar51._12_4_;
          auVar72 = vfmsub231ps_fma(auVar94,auVar80,auVar62);
          uVar109 = *(undefined4 *)(ray + k * 4);
          auVar67._4_4_ = uVar109;
          auVar67._0_4_ = uVar109;
          auVar67._8_4_ = uVar109;
          auVar67._12_4_ = uVar109;
          auVar67._16_4_ = uVar109;
          auVar67._20_4_ = uVar109;
          auVar67._24_4_ = uVar109;
          auVar67._28_4_ = uVar109;
          uVar109 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar82._4_4_ = uVar109;
          auVar82._0_4_ = uVar109;
          auVar82._8_4_ = uVar109;
          auVar82._12_4_ = uVar109;
          auVar82._16_4_ = uVar109;
          auVar82._20_4_ = uVar109;
          auVar82._24_4_ = uVar109;
          auVar82._28_4_ = uVar109;
          uVar109 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar114._4_4_ = uVar109;
          auVar114._0_4_ = uVar109;
          auVar114._8_4_ = uVar109;
          auVar114._12_4_ = uVar109;
          auVar114._16_4_ = uVar109;
          auVar114._20_4_ = uVar109;
          auVar114._24_4_ = uVar109;
          auVar114._28_4_ = uVar109;
          fVar1 = *(float *)(ray + k * 4 + 0x40);
          auVar99._4_4_ = fVar1;
          auVar99._0_4_ = fVar1;
          auVar99._8_4_ = fVar1;
          auVar99._12_4_ = fVar1;
          auVar99._16_4_ = fVar1;
          auVar99._20_4_ = fVar1;
          auVar99._24_4_ = fVar1;
          auVar99._28_4_ = fVar1;
          auVar98._4_4_ = auVar62._4_4_ * auVar63._4_4_;
          auVar98._0_4_ = auVar62._0_4_ * auVar63._0_4_;
          auVar98._8_4_ = auVar62._8_4_ * auVar63._8_4_;
          auVar98._12_4_ = auVar62._12_4_ * auVar63._12_4_;
          auVar98._16_4_ = auVar62._16_4_ * auVar63._16_4_;
          auVar98._20_4_ = auVar62._20_4_ * auVar63._20_4_;
          auVar98._24_4_ = auVar62._24_4_ * auVar63._24_4_;
          auVar98._28_4_ = auVar60._12_4_;
          auVar94 = vsubps_avx(auVar111,auVar67);
          fVar2 = *(float *)(ray + k * 4 + 0x50);
          auVar112._4_4_ = fVar2;
          auVar112._0_4_ = fVar2;
          auVar112._8_4_ = fVar2;
          auVar112._12_4_ = fVar2;
          auVar112._16_4_ = fVar2;
          auVar112._20_4_ = fVar2;
          auVar112._24_4_ = fVar2;
          auVar112._28_4_ = fVar2;
          auVar60 = vfmsub231ps_fma(auVar98,auVar87,auVar55);
          auVar98 = vsubps_avx(auVar76,auVar82);
          fVar85 = *(float *)(ray + k * 4 + 0x60);
          auVar113._4_4_ = fVar85;
          auVar113._0_4_ = fVar85;
          auVar113._8_4_ = fVar85;
          auVar113._12_4_ = fVar85;
          auVar113._16_4_ = fVar85;
          auVar113._20_4_ = fVar85;
          auVar113._24_4_ = fVar85;
          auVar113._28_4_ = fVar85;
          auVar53 = vsubps_avx(auVar102,auVar114);
          auVar20._4_4_ = fVar1 * auVar98._4_4_;
          auVar20._0_4_ = fVar1 * auVar98._0_4_;
          auVar20._8_4_ = fVar1 * auVar98._8_4_;
          auVar20._12_4_ = fVar1 * auVar98._12_4_;
          auVar20._16_4_ = fVar1 * auVar98._16_4_;
          auVar20._20_4_ = fVar1 * auVar98._20_4_;
          auVar20._24_4_ = fVar1 * auVar98._24_4_;
          auVar20._28_4_ = auVar52._12_4_;
          auVar59 = vfmsub231ps_fma(auVar20,auVar94,auVar112);
          auVar21._4_4_ = auVar87._4_4_ * auVar59._4_4_;
          auVar21._0_4_ = auVar87._0_4_ * auVar59._0_4_;
          auVar21._8_4_ = auVar87._8_4_ * auVar59._8_4_;
          auVar21._12_4_ = auVar87._12_4_ * auVar59._12_4_;
          auVar21._16_4_ = auVar87._16_4_ * 0.0;
          auVar21._20_4_ = auVar87._20_4_ * 0.0;
          auVar21._24_4_ = auVar87._24_4_ * 0.0;
          auVar21._28_4_ = auVar87._28_4_;
          auVar103._0_4_ = auVar62._0_4_ * auVar59._0_4_;
          auVar103._4_4_ = auVar62._4_4_ * auVar59._4_4_;
          auVar103._8_4_ = auVar62._8_4_ * auVar59._8_4_;
          auVar103._12_4_ = auVar62._12_4_ * auVar59._12_4_;
          auVar103._16_4_ = auVar62._16_4_ * 0.0;
          auVar103._20_4_ = auVar62._20_4_ * 0.0;
          auVar103._24_4_ = auVar62._24_4_ * 0.0;
          auVar103._28_4_ = 0;
          auVar87._4_4_ = fVar85 * auVar94._4_4_;
          auVar87._0_4_ = fVar85 * auVar94._0_4_;
          auVar87._8_4_ = fVar85 * auVar94._8_4_;
          auVar87._12_4_ = fVar85 * auVar94._12_4_;
          auVar87._16_4_ = fVar85 * auVar94._16_4_;
          auVar87._20_4_ = fVar85 * auVar94._20_4_;
          auVar87._24_4_ = fVar85 * auVar94._24_4_;
          auVar87._28_4_ = auVar62._28_4_;
          auVar64 = vfmsub231ps_fma(auVar87,auVar53,auVar99);
          auVar59 = vfmadd231ps_fma(auVar21,ZEXT1632(auVar64),auVar80);
          auVar64 = vfmadd231ps_fma(auVar103,auVar83,ZEXT1632(auVar64));
          auVar22._4_4_ = auVar55._4_4_ * auVar80._4_4_;
          auVar22._0_4_ = auVar55._0_4_ * auVar80._0_4_;
          auVar22._8_4_ = auVar55._8_4_ * auVar80._8_4_;
          auVar22._12_4_ = auVar55._12_4_ * auVar80._12_4_;
          auVar22._16_4_ = auVar55._16_4_ * auVar80._16_4_;
          auVar22._20_4_ = auVar55._20_4_ * auVar80._20_4_;
          auVar22._24_4_ = auVar55._24_4_ * auVar80._24_4_;
          auVar22._28_4_ = auVar80._28_4_;
          auVar51 = vfmsub231ps_fma(auVar22,auVar63,auVar83);
          auVar80._4_4_ = fVar2 * auVar53._4_4_;
          auVar80._0_4_ = fVar2 * auVar53._0_4_;
          auVar80._8_4_ = fVar2 * auVar53._8_4_;
          auVar80._12_4_ = fVar2 * auVar53._12_4_;
          auVar80._16_4_ = fVar2 * auVar53._16_4_;
          auVar80._20_4_ = fVar2 * auVar53._20_4_;
          auVar80._24_4_ = fVar2 * auVar53._24_4_;
          auVar80._28_4_ = auVar83._28_4_;
          auVar52 = vfmsub231ps_fma(auVar80,auVar98,auVar113);
          fVar1 = auVar51._0_4_;
          fVar2 = auVar51._4_4_;
          auVar23._4_4_ = fVar85 * fVar2;
          auVar23._0_4_ = fVar85 * fVar1;
          fVar14 = auVar51._8_4_;
          auVar23._8_4_ = fVar85 * fVar14;
          fVar15 = auVar51._12_4_;
          auVar23._12_4_ = fVar85 * fVar15;
          auVar23._16_4_ = fVar85 * 0.0;
          auVar23._20_4_ = fVar85 * 0.0;
          auVar23._24_4_ = fVar85 * 0.0;
          auVar23._28_4_ = fVar85;
          auVar68 = vfmadd231ps_fma(auVar23,ZEXT1632(auVar60),auVar112);
          auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),ZEXT1632(auVar72),auVar99);
          auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),ZEXT1632(auVar52),auVar63);
          auVar83 = vandps_avx(ZEXT1632(auVar68),local_23e0);
          uVar34 = auVar83._0_4_;
          local_26e0._0_4_ = (float)(uVar34 ^ auVar59._0_4_);
          uVar28 = auVar83._4_4_;
          local_26e0._4_4_ = (float)(uVar28 ^ auVar59._4_4_);
          uVar96 = auVar83._8_4_;
          local_26e0._8_4_ = (float)(uVar96 ^ auVar59._8_4_);
          uVar97 = auVar83._12_4_;
          local_26e0._12_4_ = (float)(uVar97 ^ auVar59._12_4_);
          local_26a0._16_4_ = auVar83._16_4_;
          local_26e0._16_4_ = local_26a0._16_4_;
          local_26a0._20_4_ = auVar83._20_4_;
          local_26e0._20_4_ = local_26a0._20_4_;
          local_26a0._24_4_ = auVar83._24_4_;
          local_26e0._24_4_ = local_26a0._24_4_;
          local_26a0._28_4_ = auVar83._28_4_;
          local_26e0._28_4_ = local_26a0._28_4_;
          auVar59 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar55,ZEXT1632(auVar52));
          local_26c0._0_4_ = (float)(uVar34 ^ auVar59._0_4_);
          local_26c0._4_4_ = (float)(uVar28 ^ auVar59._4_4_);
          local_26c0._8_4_ = (float)(uVar96 ^ auVar59._8_4_);
          local_26c0._12_4_ = (float)(uVar97 ^ auVar59._12_4_);
          local_26c0._16_4_ = local_26a0._16_4_;
          local_26c0._20_4_ = local_26a0._20_4_;
          local_26c0._24_4_ = local_26a0._24_4_;
          local_26c0._28_4_ = local_26a0._28_4_;
          auVar83 = vcmpps_avx(local_26e0,ZEXT832(0) << 0x20,5);
          auVar55 = vcmpps_avx(local_26c0,ZEXT832(0) << 0x20,5);
          auVar83 = vandps_avx(auVar83,auVar55);
          auVar88._8_4_ = 0x7fffffff;
          auVar88._0_8_ = 0x7fffffff7fffffff;
          auVar88._12_4_ = 0x7fffffff;
          auVar88._16_4_ = 0x7fffffff;
          auVar88._20_4_ = 0x7fffffff;
          auVar88._24_4_ = 0x7fffffff;
          auVar88._28_4_ = 0x7fffffff;
          local_2680 = vandps_avx(ZEXT1632(auVar68),auVar88);
          auVar55 = vcmpps_avx(ZEXT1632(auVar68),ZEXT832(0) << 0x20,4);
          auVar83 = vandps_avx(auVar83,auVar55);
          auVar104._0_4_ = local_26e0._0_4_ + local_26c0._0_4_;
          auVar104._4_4_ = local_26e0._4_4_ + local_26c0._4_4_;
          auVar104._8_4_ = local_26e0._8_4_ + local_26c0._8_4_;
          auVar104._12_4_ = local_26e0._12_4_ + local_26c0._12_4_;
          auVar104._16_4_ = local_26a0._16_4_ + local_26a0._16_4_;
          auVar104._20_4_ = local_26a0._20_4_ + local_26a0._20_4_;
          auVar104._24_4_ = local_26a0._24_4_ + local_26a0._24_4_;
          auVar104._28_4_ = local_26a0._28_4_ + local_26a0._28_4_;
          auVar55 = vcmpps_avx(auVar104,local_2680,2);
          auVar62 = auVar55 & auVar83;
          if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar62 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar62 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar62 >> 0x7f,0) != '\0') ||
                (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar62 >> 0xbf,0) != '\0') ||
              (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar62[0x1f] < '\0') {
            auVar83 = vandps_avx(auVar83,auVar55);
            auVar59 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
            auVar24._4_4_ = fVar2 * auVar53._4_4_;
            auVar24._0_4_ = fVar1 * auVar53._0_4_;
            auVar24._8_4_ = fVar14 * auVar53._8_4_;
            auVar24._12_4_ = fVar15 * auVar53._12_4_;
            auVar24._16_4_ = auVar53._16_4_ * 0.0;
            auVar24._20_4_ = auVar53._20_4_ * 0.0;
            auVar24._24_4_ = auVar53._24_4_ * 0.0;
            auVar24._28_4_ = auVar53._28_4_;
            auVar64 = vfmadd213ps_fma(auVar98,ZEXT1632(auVar60),auVar24);
            auVar64 = vfmadd213ps_fma(auVar94,ZEXT1632(auVar72),ZEXT1632(auVar64));
            local_26a0._0_4_ = (float)(uVar34 ^ auVar64._0_4_);
            local_26a0._4_4_ = (float)(uVar28 ^ auVar64._4_4_);
            local_26a0._8_4_ = (float)(uVar96 ^ auVar64._8_4_);
            local_26a0._12_4_ = (float)(uVar97 ^ auVar64._12_4_);
            fVar85 = *(float *)(ray + k * 4 + 0x30);
            auVar25._4_4_ = local_2680._4_4_ * fVar85;
            auVar25._0_4_ = local_2680._0_4_ * fVar85;
            auVar25._8_4_ = local_2680._8_4_ * fVar85;
            auVar25._12_4_ = local_2680._12_4_ * fVar85;
            auVar25._16_4_ = local_2680._16_4_ * fVar85;
            auVar25._20_4_ = local_2680._20_4_ * fVar85;
            auVar25._24_4_ = local_2680._24_4_ * fVar85;
            auVar25._28_4_ = fVar85;
            auVar83 = vcmpps_avx(auVar25,local_26a0,1);
            fVar85 = *(float *)(ray + k * 4 + 0x80);
            auVar78 = ZEXT3264(CONCAT428(fVar85,CONCAT424(fVar85,CONCAT420(fVar85,CONCAT416(fVar85,
                                                  CONCAT412(fVar85,CONCAT48(fVar85,CONCAT44(fVar85,
                                                  fVar85))))))));
            auVar77._0_4_ = local_2680._0_4_ * fVar85;
            auVar77._4_4_ = local_2680._4_4_ * fVar85;
            auVar77._8_4_ = local_2680._8_4_ * fVar85;
            auVar77._12_4_ = local_2680._12_4_ * fVar85;
            auVar77._16_4_ = local_2680._16_4_ * fVar85;
            auVar77._20_4_ = local_2680._20_4_ * fVar85;
            auVar77._24_4_ = local_2680._24_4_ * fVar85;
            auVar77._28_4_ = 0;
            auVar55 = vcmpps_avx(local_26a0,auVar77,2);
            auVar83 = vandps_avx(auVar83,auVar55);
            auVar64 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
            auVar59 = vpand_avx(auVar59,auVar64);
            auVar83 = vpmovzxwd_avx2(auVar59);
            auVar83 = vpslld_avx2(auVar83,0x1f);
            if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar83 >> 0x7f,0) != '\0') ||
                  (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar83 >> 0xbf,0) != '\0') ||
                (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar83[0x1f] < '\0') {
              local_2880 = vpsrad_avx2(auVar83,0x1f);
              local_2660 = ZEXT1632(auVar72);
              local_2640 = ZEXT1632(auVar60);
              local_2620 = ZEXT1632(auVar51);
              local_2600 = local_2880;
              local_2520 = local_24e0;
              auVar55 = vrcpps_avx(local_2680);
              auVar107._8_4_ = 0x3f800000;
              auVar107._0_8_ = 0x3f8000003f800000;
              auVar107._12_4_ = 0x3f800000;
              auVar107._16_4_ = 0x3f800000;
              auVar107._20_4_ = 0x3f800000;
              auVar107._24_4_ = 0x3f800000;
              auVar107._28_4_ = 0x3f800000;
              auVar64 = vfnmadd213ps_fma(local_2680,auVar55,auVar107);
              auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar55,auVar55);
              fVar85 = auVar64._0_4_;
              fVar90 = auVar64._4_4_;
              local_25a0._4_4_ = fVar90 * local_26a0._4_4_;
              local_25a0._0_4_ = fVar85 * local_26a0._0_4_;
              fVar91 = auVar64._8_4_;
              local_25a0._8_4_ = fVar91 * local_26a0._8_4_;
              fVar92 = auVar64._12_4_;
              local_25a0._12_4_ = fVar92 * local_26a0._12_4_;
              local_25a0._16_4_ = local_26a0._16_4_ * 0.0;
              local_25a0._20_4_ = local_26a0._20_4_ * 0.0;
              local_25a0._24_4_ = local_26a0._24_4_ * 0.0;
              local_25a0._28_4_ = auVar55._28_4_;
              auVar84 = ZEXT3264(local_25a0);
              auVar26._4_4_ = fVar90 * local_26e0._4_4_;
              auVar26._0_4_ = fVar85 * local_26e0._0_4_;
              auVar26._8_4_ = fVar91 * local_26e0._8_4_;
              auVar26._12_4_ = fVar92 * local_26e0._12_4_;
              auVar26._16_4_ = local_26a0._16_4_ * 0.0;
              auVar26._20_4_ = local_26a0._20_4_ * 0.0;
              auVar26._24_4_ = local_26a0._24_4_ * 0.0;
              auVar26._28_4_ = local_26a0._28_4_;
              auVar55 = vminps_avx(auVar26,auVar107);
              auVar27._4_4_ = fVar90 * local_26c0._4_4_;
              auVar27._0_4_ = fVar85 * local_26c0._0_4_;
              auVar27._8_4_ = fVar91 * local_26c0._8_4_;
              auVar27._12_4_ = fVar92 * local_26c0._12_4_;
              auVar27._16_4_ = local_26a0._16_4_ * 0.0;
              auVar27._20_4_ = local_26a0._20_4_ * 0.0;
              auVar27._24_4_ = local_26a0._24_4_ * 0.0;
              auVar27._28_4_ = local_26a0._28_4_;
              auVar62 = vminps_avx(auVar27,auVar107);
              auVar63 = vsubps_avx(auVar107,auVar55);
              auVar80 = vsubps_avx(auVar107,auVar62);
              local_25c0 = vblendvps_avx(auVar62,auVar63,local_24e0);
              local_25e0 = vblendvps_avx(auVar55,auVar80,local_24e0);
              fVar85 = local_2500._0_4_;
              local_2580._0_4_ = auVar72._0_4_ * fVar85;
              fVar90 = local_2500._4_4_;
              local_2580._4_4_ = auVar72._4_4_ * fVar90;
              fVar91 = local_2500._8_4_;
              local_2580._8_4_ = auVar72._8_4_ * fVar91;
              fVar92 = local_2500._12_4_;
              local_2580._12_4_ = auVar72._12_4_ * fVar92;
              fVar16 = local_2500._16_4_;
              local_2580._16_4_ = fVar16 * 0.0;
              fVar17 = local_2500._20_4_;
              local_2580._20_4_ = fVar17 * 0.0;
              fVar18 = local_2500._24_4_;
              local_2580._24_4_ = fVar18 * 0.0;
              local_2580._28_4_ = 0;
              local_2560._0_4_ = fVar85 * auVar60._0_4_;
              local_2560._4_4_ = fVar90 * auVar60._4_4_;
              local_2560._8_4_ = fVar91 * auVar60._8_4_;
              local_2560._12_4_ = fVar92 * auVar60._12_4_;
              local_2560._16_4_ = fVar16 * 0.0;
              local_2560._20_4_ = fVar17 * 0.0;
              local_2560._24_4_ = fVar18 * 0.0;
              local_2560._28_4_ = 0;
              local_2540._0_4_ = fVar85 * fVar1;
              local_2540._4_4_ = fVar90 * fVar2;
              local_2540._8_4_ = fVar91 * fVar14;
              local_2540._12_4_ = fVar92 * fVar15;
              local_2540._16_4_ = fVar16 * 0.0;
              local_2540._20_4_ = fVar17 * 0.0;
              local_2540._24_4_ = fVar18 * 0.0;
              local_2540._28_4_ = 0;
              auVar54._8_4_ = 0x7f800000;
              auVar54._0_8_ = 0x7f8000007f800000;
              auVar54._12_4_ = 0x7f800000;
              auVar54._16_4_ = 0x7f800000;
              auVar54._20_4_ = 0x7f800000;
              auVar54._24_4_ = 0x7f800000;
              auVar54._28_4_ = 0x7f800000;
              auVar83 = vblendvps_avx(auVar54,local_25a0,auVar83);
              auVar55 = vshufps_avx(auVar83,auVar83,0xb1);
              auVar55 = vminps_avx(auVar83,auVar55);
              auVar62 = vshufpd_avx(auVar55,auVar55,5);
              auVar55 = vminps_avx(auVar55,auVar62);
              auVar62 = vpermpd_avx2(auVar55,0x4e);
              auVar55 = vminps_avx(auVar55,auVar62);
              auVar83 = vcmpps_avx(auVar83,auVar55,0);
              auVar64 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
              auVar59 = vpand_avx(auVar64,auVar59);
              auVar83 = vpmovzxwd_avx2(auVar59);
              auVar55 = vpslld_avx2(auVar83,0x1f);
              auVar83 = local_2880;
              if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar55 >> 0x7f,0) != '\0') ||
                    (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar55 >> 0xbf,0) != '\0') ||
                  (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar55[0x1f] < '\0') {
                auVar83 = vpsrad_avx2(auVar55,0x1f);
              }
              auVar89 = ZEXT3264(auVar83);
LAB_005eacf9:
              uVar28 = vmovmskps_avx(auVar89._0_32_);
              uVar34 = 0;
              for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
                uVar34 = uVar34 + 1;
              }
              uVar40 = (ulong)uVar34;
              local_2710 = *(uint *)((long)&local_23c0 + uVar40 * 4);
              pGVar10 = (pSVar8->geometries).items[local_2710].ptr;
              if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_2880 + uVar40 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar40 = (ulong)(uVar34 << 2);
                  uVar109 = *(undefined4 *)(local_25e0 + uVar40);
                  uVar3 = *(undefined4 *)(local_25c0 + uVar40);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a0 + uVar40);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2580 + uVar40);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2560 + uVar40);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2540 + uVar40);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar109;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_27a0 + uVar40)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = local_2710;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_005eab2a;
                }
                local_2860 = auVar84._0_32_;
                local_28a0 = auVar78._0_32_;
                uVar47 = (ulong)(uVar34 * 4);
                uVar109 = *(undefined4 *)(local_25e0 + uVar47);
                local_2740._4_4_ = uVar109;
                local_2740._0_4_ = uVar109;
                local_2740._8_4_ = uVar109;
                local_2740._12_4_ = uVar109;
                local_2730 = *(undefined4 *)(local_25c0 + uVar47);
                local_2720 = *(undefined4 *)((long)&local_27a0 + uVar47);
                uVar109 = *(undefined4 *)(local_2580 + uVar47);
                uVar3 = *(undefined4 *)(local_2560 + uVar47);
                local_2760._4_4_ = uVar3;
                local_2760._0_4_ = uVar3;
                local_2760._8_4_ = uVar3;
                local_2760._12_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_2540 + uVar47);
                local_2750._4_4_ = uVar3;
                local_2750._0_4_ = uVar3;
                local_2750._8_4_ = uVar3;
                local_2750._12_4_ = uVar3;
                local_2770[0] = (RTCHitN)(char)uVar109;
                local_2770[1] = (RTCHitN)(char)((uint)uVar109 >> 8);
                local_2770[2] = (RTCHitN)(char)((uint)uVar109 >> 0x10);
                local_2770[3] = (RTCHitN)(char)((uint)uVar109 >> 0x18);
                local_2770[4] = (RTCHitN)(char)uVar109;
                local_2770[5] = (RTCHitN)(char)((uint)uVar109 >> 8);
                local_2770[6] = (RTCHitN)(char)((uint)uVar109 >> 0x10);
                local_2770[7] = (RTCHitN)(char)((uint)uVar109 >> 0x18);
                local_2770[8] = (RTCHitN)(char)uVar109;
                local_2770[9] = (RTCHitN)(char)((uint)uVar109 >> 8);
                local_2770[10] = (RTCHitN)(char)((uint)uVar109 >> 0x10);
                local_2770[0xb] = (RTCHitN)(char)((uint)uVar109 >> 0x18);
                local_2770[0xc] = (RTCHitN)(char)uVar109;
                local_2770[0xd] = (RTCHitN)(char)((uint)uVar109 >> 8);
                local_2770[0xe] = (RTCHitN)(char)((uint)uVar109 >> 0x10);
                local_2770[0xf] = (RTCHitN)(char)((uint)uVar109 >> 0x18);
                uStack_272c = local_2730;
                uStack_2728 = local_2730;
                uStack_2724 = local_2730;
                uStack_271c = local_2720;
                uStack_2718 = local_2720;
                uStack_2714 = local_2720;
                uStack_270c = local_2710;
                uStack_2708 = local_2710;
                uStack_2704 = local_2710;
                vpcmpeqd_avx2(ZEXT1632(local_2740),ZEXT1632(local_2740));
                uStack_26fc = context->user->instID[0];
                local_2700 = uStack_26fc;
                uStack_26f8 = uStack_26fc;
                uStack_26f4 = uStack_26fc;
                uStack_26f0 = context->user->instPrimID[0];
                uStack_26ec = uStack_26f0;
                uStack_26e8 = uStack_26f0;
                uStack_26e4 = uStack_26f0;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a0 + uVar47);
                local_2950 = *local_2938;
                local_28d0.valid = (int *)local_2950;
                local_28d0.geometryUserPtr = pGVar10->userPtr;
                local_28d0.context = context->user;
                local_28d0.hit = local_2770;
                local_28d0.N = 4;
                local_28d0.ray = (RTCRayN *)ray;
                if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar10->intersectionFilterN)(&local_28d0);
                }
                if (local_2950 == (undefined1  [16])0x0) {
                  auVar59 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar59 = auVar59 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var13 = context->args->filter;
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var13)(&local_28d0);
                  }
                  auVar64 = vpcmpeqd_avx(local_2950,_DAT_01f7aa10);
                  auVar59 = auVar64 ^ _DAT_01f7ae20;
                  if (local_2950 != (undefined1  [16])0x0) {
                    auVar64 = auVar64 ^ _DAT_01f7ae20;
                    auVar68 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])local_28d0.hit);
                    *(undefined1 (*) [16])(local_28d0.ray + 0xc0) = auVar68;
                    auVar68 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])(local_28d0.hit + 0x10));
                    *(undefined1 (*) [16])(local_28d0.ray + 0xd0) = auVar68;
                    auVar68 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])(local_28d0.hit + 0x20));
                    *(undefined1 (*) [16])(local_28d0.ray + 0xe0) = auVar68;
                    auVar68 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])(local_28d0.hit + 0x30));
                    *(undefined1 (*) [16])(local_28d0.ray + 0xf0) = auVar68;
                    auVar68 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])(local_28d0.hit + 0x40));
                    *(undefined1 (*) [16])(local_28d0.ray + 0x100) = auVar68;
                    auVar68 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])(local_28d0.hit + 0x50));
                    *(undefined1 (*) [16])(local_28d0.ray + 0x110) = auVar68;
                    auVar68 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])(local_28d0.hit + 0x60));
                    *(undefined1 (*) [16])(local_28d0.ray + 0x120) = auVar68;
                    auVar68 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])(local_28d0.hit + 0x70));
                    *(undefined1 (*) [16])(local_28d0.ray + 0x130) = auVar68;
                    auVar64 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])(local_28d0.hit + 0x80));
                    *(undefined1 (*) [16])(local_28d0.ray + 0x140) = auVar64;
                  }
                }
                auVar52._8_8_ = 0x100000001;
                auVar52._0_8_ = 0x100000001;
                if ((auVar52 & auVar59) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_28a0._0_4_;
                }
                else {
                  local_28a0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_2880 + uVar40 * 4) = 0;
                auVar78 = ZEXT3264(local_28a0);
                uVar109 = local_28a0._0_4_;
                auVar57._4_4_ = uVar109;
                auVar57._0_4_ = uVar109;
                auVar57._8_4_ = uVar109;
                auVar57._12_4_ = uVar109;
                auVar57._16_4_ = uVar109;
                auVar57._20_4_ = uVar109;
                auVar57._24_4_ = uVar109;
                auVar57._28_4_ = uVar109;
                auVar84 = ZEXT3264(local_2860);
                auVar83 = vcmpps_avx(local_2860,auVar57,2);
                local_2880 = vandps_avx(auVar83,local_2880);
              }
              auVar89 = ZEXT3264(local_2880);
              if ((((((((local_2880 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_2880 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_2880 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_2880 >> 0x7f,0) == '\0') &&
                    (local_2880 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_2880 >> 0xbf,0) == '\0') &&
                  (local_2880 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_2880[0x1f]) goto LAB_005eab2a;
              auVar56._8_4_ = 0x7f800000;
              auVar56._0_8_ = 0x7f8000007f800000;
              auVar56._12_4_ = 0x7f800000;
              auVar56._16_4_ = 0x7f800000;
              auVar56._20_4_ = 0x7f800000;
              auVar56._24_4_ = 0x7f800000;
              auVar56._28_4_ = 0x7f800000;
              auVar83 = vblendvps_avx(auVar56,auVar84._0_32_,local_2880);
              auVar55 = vshufps_avx(auVar83,auVar83,0xb1);
              auVar55 = vminps_avx(auVar83,auVar55);
              auVar62 = vshufpd_avx(auVar55,auVar55,5);
              auVar55 = vminps_avx(auVar55,auVar62);
              auVar62 = vpermpd_avx2(auVar55,0x4e);
              auVar55 = vminps_avx(auVar55,auVar62);
              auVar83 = vcmpps_avx(auVar83,auVar55,0);
              auVar55 = local_2880 & auVar83;
              if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar55 >> 0x7f,0) != '\0') ||
                    (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar55 >> 0xbf,0) != '\0') ||
                  (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar55[0x1f] < '\0') {
                auVar83 = vandps_avx(auVar83,local_2880);
                auVar89 = ZEXT3264(auVar83);
              }
              goto LAB_005eacf9;
            }
          }
LAB_005eab2a:
          lVar31 = lVar31 + 1;
        } while (lVar31 != local_2928);
      }
      uVar109 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar58 = ZEXT3264(CONCAT428(uVar109,CONCAT424(uVar109,CONCAT420(uVar109,CONCAT416(uVar109,
                                                  CONCAT412(uVar109,CONCAT48(uVar109,CONCAT44(
                                                  uVar109,uVar109))))))));
      auVar78 = ZEXT3264(local_2400);
      auVar84 = ZEXT3264(local_2420);
      auVar89 = ZEXT3264(local_2440);
      auVar95 = ZEXT3264(local_2460);
      auVar100 = ZEXT3264(local_2480);
      auVar105 = ZEXT3264(local_24a0);
      auVar108 = ZEXT3264(local_24c0);
      uVar40 = local_2930;
    }
    if (pauVar29 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }